

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsnav_ins.c
# Opt level: O1

void fsnav_ins_step_sync(void)

{
  fsnav_imu *pfVar1;
  undefined8 in_RAX;
  char *__nptr;
  double dVar2;
  undefined1 auVar3 [16];
  char freq_token [5];
  undefined4 local_8;
  uint local_4;
  
  _local_8 = CONCAT44((uint)((ulong)in_RAX >> 0x20) & 0xffffff00,0x71657266);
  pfVar1 = fsnav->imu;
  if (pfVar1 == (fsnav_imu *)0x0) {
    return;
  }
  if (fsnav->mode == 0) {
    fsnav->t = 0.0;
    fsnav_ins_step_sync::i = 0;
    __nptr = fsnav_locate_token((char *)&local_8,pfVar1->cfg,pfVar1->cfglength,'=');
    if (((__nptr == (char *)0x0) || (dVar2 = atof(__nptr), dVar2 < 50.0)) || (3200.0 < dVar2)) {
      dVar2 = 100.0;
    }
    fsnav_ins_step_sync::dt = 1.0 / dVar2;
    return;
  }
  if (fsnav->mode < 0) {
    return;
  }
  pfVar1->w_valid = '\0';
  pfVar1->f_valid = '\0';
  fsnav_ins_step_sync::i = fsnav_ins_step_sync::i + 1;
  auVar3._8_4_ = (int)(fsnav_ins_step_sync::i >> 0x20);
  auVar3._0_8_ = fsnav_ins_step_sync::i;
  auVar3._12_4_ = 0x45300000;
  pfVar1->t = ((auVar3._8_8_ - 1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,(int)fsnav_ins_step_sync::i) - 4503599627370496.0)) *
              fsnav_ins_step_sync::dt;
  return;
}

Assistant:

void fsnav_ins_step_sync(void) 
{
	const char   freq_token[] = "freq";     // имя параметра в строке конфигурации, содержащего частоту
	const double freq_range[] = {50, 3200}; // диапазон допустимых частот
	const double freq_default = 100;        // частота по умолчанию

	static double        dt   = -1;         // шаг по времени
	static unsigned long i    =  0;         // номер шага

	char *cfg_ptr;                          // указатель на строку конфигурации

	// проверка инициализации инерциальной подсистемы на шине
	if (fsnav->imu == NULL)
		return;

	// инициализация
	if (fsnav->mode == 0) {
		// начальные значения
		fsnav->t = 0;
		i = 0;
		// поиск значения частоты в конфигурации
		cfg_ptr = fsnav_locate_token(freq_token, fsnav->imu->cfg, fsnav->imu->cfglength, '=');
		if (cfg_ptr != NULL)
			dt = atof(cfg_ptr);	
		// если значение не найдено в конфигурации, или значение вне заданных пределов, установка по умолчанию
		if (cfg_ptr == NULL || dt < freq_range[0] || freq_range[1] < dt)
			dt = freq_default;
		// вычисление шага по времени
		dt = 1 / dt;
	}

	// завершение работы
	else if (fsnav->mode < 0) {}

	// шаг основного цикла	
	else {
		// сброс достоверности инерциальных датчиков
		fsnav->imu->w_valid = 0;
		fsnav->imu->f_valid = 0;
		// шаг по времени
		i++;
		fsnav->imu->t = i*dt;
	}
}